

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# active_cover.cc
# Opt level: O0

float get_threshold(float sum_loss,float t,float c0,float alpha)

{
  float in_XMM0_Da;
  double dVar1;
  double dVar2;
  double dVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float threshold;
  float avg_loss;
  undefined4 local_4;
  
  if (3.0 <= in_XMM1_Da) {
    dVar1 = std::sqrt((double)(ulong)(uint)((in_XMM2_Da * (in_XMM0_Da / in_XMM1_Da)) / in_XMM1_Da));
    dVar2 = std::fmax((double)(ulong)(uint)(in_XMM3_Da * 2.0),5.34643470770547e-315);
    dVar3 = std::log((double)(ulong)(uint)in_XMM1_Da);
    local_4 = SUB84(dVar1,0) + (SUB84(dVar2,0) * in_XMM2_Da * SUB84(dVar3,0)) / in_XMM1_Da;
  }
  else {
    local_4 = 1.0;
  }
  return local_4;
}

Assistant:

float get_threshold(float sum_loss, float t, float c0, float alpha)
{
  if (t < 3.f)
  {
    return 1.f;
  }
  else
  {
    float avg_loss = sum_loss / t;
    float threshold = sqrt(c0 * avg_loss / t) + fmax(2.f * alpha, 4.f) * c0 * log(t) / t;
    return threshold;
  }
}